

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_font * nk_font_atlas_add_compressed
                    (nk_font_atlas *atlas,void *compressed_data,nk_size compressed_size,float height
                    ,nk_font_config *config)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  nk_plugin_alloc p_Var4;
  uint uVar5;
  uchar *puVar6;
  nk_font *pnVar7;
  ushort *puVar8;
  long lVar9;
  uint uVar10;
  nk_font_config *pnVar11;
  ulong uVar12;
  ushort *puVar13;
  byte bVar14;
  nk_font_config local_88;
  
  bVar14 = 0;
  if ((((compressed_data == (void *)0x0 || atlas == (nk_font_atlas *)0x0) ||
       ((atlas->temporary).alloc == (nk_plugin_alloc)0x0)) ||
      ((atlas->temporary).free == (nk_plugin_free)0x0)) ||
     ((p_Var4 = (atlas->permanent).alloc, p_Var4 == (nk_plugin_alloc)0x0 ||
      ((atlas->permanent).free == (nk_plugin_free)0x0)))) {
    pnVar7 = (nk_font *)0x0;
  }
  else {
    uVar2 = *(uint *)((long)compressed_data + 8);
    uVar5 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8;
    pnVar7 = (nk_font *)0x0;
    puVar6 = (uchar *)(*p_Var4)((atlas->permanent).userdata,(void *)0x0,
                                (ulong)uVar5 | (ulong)(uVar2 << 0x18));
    if (puVar6 != (uchar *)0x0) {
      uVar3 = *compressed_data;
      if (((uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) ==
           0x57bc0000) &&
         (uVar3 = *(uint *)((long)compressed_data + 4),
         ((uVar3 >> 0x18 == 0 && (uVar3 & 0xff0000) == 0) && (uVar3 & 0xff00) == 0) &&
         (uVar3 & 0xff) == 0)) {
        uVar3 = *(uint *)((long)compressed_data + 8);
        nk__barrier3 = (uchar *)((compressed_size & 0xffffffff) + (long)compressed_data);
        puVar13 = (ushort *)((long)compressed_data + 0x10);
        nk__barrier2 = (uchar *)compressed_data;
        nk__barrier = puVar6 + (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                               uVar3 << 0x18);
        nk__barrier4 = puVar6;
        nk__dout = puVar6;
        do {
          bVar1 = (byte)*puVar13;
          uVar10 = (uint)bVar1;
          if (bVar1 < 0x20) {
            if (bVar1 < 0x18) {
              if (bVar1 < 0x10) {
                if (bVar1 < 8) {
                  if (bVar1 == 4) {
                    nk__match(nk__dout +
                              ~((ulong)*(byte *)((long)puVar13 + 3) |
                                (ulong)*(byte *)((long)puVar13 + 1) << 0x10 |
                               (ulong)(byte)puVar13[1] << 8),
                              (ushort)(puVar13[2] << 8 | puVar13[2] >> 8) + 1);
                    puVar8 = puVar13 + 3;
                  }
                  else {
                    if (uVar10 == 6) {
                      uVar12 = ~((ulong)*(byte *)((long)puVar13 + 3) |
                                 (ulong)*(byte *)((long)puVar13 + 1) << 0x10 |
                                (ulong)(byte)puVar13[1] << 8);
                      uVar10 = (uint)(byte)puVar13[2];
                      goto LAB_00114fce;
                    }
                    puVar8 = puVar13;
                    if (uVar10 == 7) {
                      nk__lit((byte *)((long)puVar13 + 3),
                              (ushort)(*(ushort *)((long)puVar13 + 1) << 8 |
                                      *(ushort *)((long)puVar13 + 1) >> 8) + 1);
                      puVar8 = (ushort *)
                               ((long)puVar13 +
                               (ulong)(ushort)(*(ushort *)((long)puVar13 + 1) << 8 |
                                              *(ushort *)((long)puVar13 + 1) >> 8) + 4);
                    }
                  }
                }
                else {
                  nk__lit((uchar *)(puVar13 + 1),
                          ((uint)bVar1 * 0x100 + (uint)*(byte *)((long)puVar13 + 1)) - 0x7ff);
                  puVar8 = (ushort *)
                           ((long)puVar13 + ((ulong)(ushort)(*puVar13 << 8 | *puVar13 >> 8) - 0x7fd)
                           );
                }
              }
              else {
                uVar12 = -(ulong)(((uint)*(byte *)((long)puVar13 + 1) * 0x100 +
                                  ((uint)(byte)puVar13[1] | (uint)bVar1 << 0x10)) - 0xfffff);
                uVar10 = (uint)(ushort)(*(ushort *)((long)puVar13 + 3) << 8 |
                                       *(ushort *)((long)puVar13 + 3) >> 8);
LAB_00114fce:
                nk__match(nk__dout + uVar12,uVar10 + 1);
                puVar8 = (ushort *)((long)puVar13 + 5);
              }
            }
            else {
              nk__match(nk__dout +
                        -(ulong)(((uint)*(byte *)((long)puVar13 + 1) * 0x100 +
                                 ((uint)(byte)puVar13[1] | (uint)bVar1 << 0x10)) - 0x17ffff),
                        *(byte *)((long)puVar13 + 3) + 1);
              puVar8 = puVar13 + 2;
            }
          }
          else if ((char)bVar1 < '\0') {
            nk__match(nk__dout + ~(ulong)*(byte *)((long)puVar13 + 1),uVar10 - 0x7f);
            puVar8 = puVar13 + 1;
          }
          else if (bVar1 < 0x40) {
            nk__lit((byte *)((long)puVar13 + 1),uVar10 - 0x1f);
            puVar8 = (ushort *)((long)puVar13 + ((ulong)(byte)*puVar13 - 0x1e));
          }
          else {
            nk__match(nk__dout +
                      -(ulong)(((uint)*(byte *)((long)puVar13 + 1) + (uint)bVar1 * 0x100) - 0x3fff),
                      (byte)puVar13[1] + 1);
            puVar8 = (ushort *)((long)puVar13 + 3);
          }
        } while ((puVar8 != puVar13) &&
                (puVar13 = puVar8,
                nk__dout <=
                puVar6 + (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                         uVar3 << 0x18)));
      }
      if (config == (nk_font_config *)0x0) {
        local_88.padding[2] = '\0';
        local_88.next = (nk_font_config *)0x0;
        local_88.merge_mode = '\0';
        local_88.pixel_snap = '\0';
        local_88.oversample_v = '\x01';
        local_88.oversample_h = '\x03';
        local_88.padding[0] = '\0';
        local_88.padding[1] = '\0';
        local_88.coord_type = NK_COORD_UV;
        local_88.spacing.x = 0.0;
        local_88.spacing.y = 0.0;
        local_88.range = nk_font_default_glyph_ranges::ranges;
        local_88.font = (nk_baked_font *)0x0;
        local_88.fallback_glyph = 0x3f;
        local_88._68_8_ = 0;
        local_88._76_8_ = 0;
        local_88.p._4_4_ = 0;
      }
      else {
        pnVar11 = &local_88;
        for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
          pnVar11->next = config->next;
          config = (nk_font_config *)((long)config + (ulong)bVar14 * -0x10 + 8);
          pnVar11 = (nk_font_config *)((long)pnVar11 + ((ulong)bVar14 * -2 + 1) * 8);
        }
      }
      local_88.ttf_blob._0_3_ = SUB83(puVar6,0);
      local_88.ttf_blob._3_5_ = (undefined5)((ulong)puVar6 >> 0x18);
      local_88.ttf_size._0_3_ = (undefined3)uVar5;
      local_88.ttf_size._3_5_ = (uint5)(byte)uVar2;
      local_88.ttf_data_owned_by_atlas = '\x01';
      local_88.size = height;
      pnVar7 = nk_font_atlas_add(atlas,&local_88);
    }
  }
  return pnVar7;
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_compressed(struct nk_font_atlas *atlas,
void *compressed_data, nk_size compressed_size, float height,
const struct nk_font_config *config)
{
unsigned int decompressed_size;
void *decompressed_data;
struct nk_font_config cfg;

NK_ASSERT(atlas);
NK_ASSERT(atlas->temporary.alloc);
NK_ASSERT(atlas->temporary.free);
NK_ASSERT(atlas->permanent.alloc);
NK_ASSERT(atlas->permanent.free);

NK_ASSERT(compressed_data);
NK_ASSERT(compressed_size);
if (!atlas || !compressed_data || !atlas->temporary.alloc || !atlas->temporary.free ||
!atlas->permanent.alloc || !atlas->permanent.free)
return 0;

decompressed_size = nk_decompress_length((unsigned char*)compressed_data);
decompressed_data = atlas->permanent.alloc(atlas->permanent.userdata,0,decompressed_size);
NK_ASSERT(decompressed_data);
if (!decompressed_data) return 0;
nk_decompress((unsigned char*)decompressed_data, (unsigned char*)compressed_data,
(unsigned int)compressed_size);

cfg = (config) ? *config: nk_font_config(height);
cfg.ttf_blob = decompressed_data;
cfg.ttf_size = decompressed_size;
cfg.size = height;
cfg.ttf_data_owned_by_atlas = 1;
return nk_font_atlas_add(atlas, &cfg);
}